

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackOverflowCase::iterate
          (VertexFeedbackOverflowCase *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  MessageBuilder local_6e0;
  int local_560;
  int local_55c;
  int component_1;
  int vertex_1;
  int local_3d4;
  int local_3d0;
  int component;
  int vertex;
  undefined1 local_3a2;
  allocator<char> local_3a1;
  string local_3a0;
  byte local_379;
  undefined1 local_378 [7];
  bool error;
  vector<float,_std::allocator<float>_> feedback;
  void *ptr;
  MessageBuilder local_1d8;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  long lStack_18;
  int posLocation;
  Functions *gl;
  VertexFeedbackOverflowCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar3);
  pcVar1 = *(code **)(lStack_18 + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  local_1c = (*pcVar1)(dVar4,"a_position");
  if (local_1c == -1) {
    local_55 = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"a_position location was -1",&local_41);
    tcu::TestError::TestError(pTVar6,&local_40);
    local_55 = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lStack_18 + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar1)(dVar4);
  (**(code **)(lStack_18 + 0x40))(0x8892,this->m_arrayBuf);
  (**(code **)(lStack_18 + 0x19f0))(local_1c,4,0x1406,0,0,0);
  (**(code **)(lStack_18 + 0x610))(local_1c);
  if (this->m_method == METHOD_DRAW_ELEMENTS) {
    (**(code **)(lStack_18 + 0x40))(0x8893,this->m_elementBuf);
    dVar4 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar4,"bind buffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0x1723);
  }
  (**(code **)(lStack_18 + 0x48))(0x8c8e,0,this->m_feedbackBuf);
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"bind buffer base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1727);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1d8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [23])"Capturing 2 triangles.");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d8);
  (**(code **)(lStack_18 + 0x30))(4);
  if (this->m_method == METHOD_DRAW_ELEMENTS) {
    (**(code **)(lStack_18 + 0x568))(4,6,0x1403,0);
  }
  else if (this->m_method == METHOD_DRAW_ARRAYS) {
    (**(code **)(lStack_18 + 0x538))(5,0,4);
  }
  (**(code **)(lStack_18 + 0x638))();
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"capture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1735);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ptr,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&ptr,
                      (char (*) [75])
                      "Verifying final triangle was not partially written to the feedback buffer.");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ptr);
  feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(**(code **)(lStack_18 + 0xd00))(0x8c8e,0,0x50,1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_378);
  local_379 = 0;
  dVar4 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar4,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x173e);
  if (feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_378,0x14);
    pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_378,0);
    ::deMemcpy(pvVar9,feedback.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0x50);
    cVar2 = (**(code **)(lStack_18 + 0x1670))(0x8c8e);
    if (cVar2 == '\x01') {
      for (local_3d0 = 0; local_3d0 < 3; local_3d0 = local_3d0 + 1) {
        for (local_3d4 = 0; local_3d4 < 4; local_3d4 = local_3d4 + 1) {
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_378,
                              (long)(local_3d0 * 4 + local_3d4));
          if ((*pvVar9 != 1.0) || (NAN(*pvVar9))) {
            pTVar7 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&component_1,pTVar7,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&component_1,
                                (char (*) [24])"Feedback buffer vertex ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3d0);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])", component ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3d4);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [39])": unexpected value, expected 1.0, got ");
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)local_378,
                                (long)(local_3d4 + local_3d0 * 4));
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,pvVar9);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&component_1);
            local_379 = 1;
          }
        }
      }
      for (local_55c = 3; local_55c < 5; local_55c = local_55c + 1) {
        for (local_560 = 0; local_560 < 4; local_560 = local_560 + 1) {
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_378,
                              (long)(local_55c * 4 + local_560));
          if ((*pvVar9 != -1.0) || (NAN(*pvVar9))) {
            pTVar7 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_6e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (&local_6e0,(char (*) [24])"Feedback buffer vertex ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_55c);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])", component ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_560);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [40])": unexpected value, expected -1.0, got ");
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)local_378,
                                (long)(local_560 + local_55c * 4));
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,pvVar9);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_6e0);
            local_379 = 1;
          }
        }
      }
      if ((local_379 & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Feedback result validation failed");
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_378);
      return STOP;
    }
    component._2_1_ = 1;
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertex,"unmapBuffer returned false",
               (allocator<char> *)((long)&component + 3));
    tcu::TestError::TestError(pTVar6,(string *)&vertex);
    component._2_1_ = 0;
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_3a2 = 1;
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"mapBufferRange returned null",&local_3a1);
  tcu::TestError::TestError(pTVar6,&local_3a0);
  local_3a2 = 0;
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

VertexFeedbackOverflowCase::IterateResult VertexFeedbackOverflowCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");

	if (posLocation == -1)
		throw tcu::TestError("a_position location was -1");

	gl.useProgram(m_program->getProgram());

	gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(posLocation);

	if (m_method == METHOD_DRAW_ELEMENTS)
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuf);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffers");
	}

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_feedbackBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffer base");

	m_testCtx.getLog() << tcu::TestLog::Message << "Capturing 2 triangles." << tcu::TestLog::EndMessage;

	gl.beginTransformFeedback(GL_TRIANGLES);

	if (m_method == METHOD_DRAW_ELEMENTS)
		gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, DE_NULL);
	else if (m_method == METHOD_DRAW_ARRAYS)
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	else
		DE_ASSERT(false);

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "capture");

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying final triangle was not partially written to the feedback buffer." << tcu::TestLog::EndMessage;

	{
		const void*				ptr		= gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(float[4]) * 5, GL_MAP_READ_BIT);
		std::vector<float>		feedback;
		bool					error	= false;

		GLU_EXPECT_NO_ERROR(gl.getError(), "mapBufferRange");
		if (!ptr)
			throw tcu::TestError("mapBufferRange returned null");

		feedback.resize(5*4);
		deMemcpy(&feedback[0], ptr, sizeof(float[4]) * 5);

		if (gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER) != GL_TRUE)
			throw tcu::TestError("unmapBuffer returned false");

		// Verify vertices 0 - 2
		for (int vertex = 0; vertex < 3; ++vertex)
		{
			for (int component = 0; component < 4; ++component)
			{
				if (feedback[vertex*4 + component] != 1.0f)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Feedback buffer vertex " << vertex << ", component " << component << ": unexpected value, expected 1.0, got " << feedback[vertex*4 + component]
						<< tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}

		// Verify vertices 3 - 4
		for (int vertex = 3; vertex < 5; ++vertex)
		{
			for (int component = 0; component < 4; ++component)
			{
				if (feedback[vertex*4 + component] != -1.0f)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Feedback buffer vertex " << vertex << ", component " << component << ": unexpected value, expected -1.0, got " << feedback[vertex*4 + component]
						<< tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Feedback result validation failed");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}